

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AllocateOptionsImpl<google::protobuf::EnumValueDescriptor>
          (DescriptorBuilder *this,string *name_scope,string *element_name,OptionsType *orig_options
          ,EnumValueDescriptor *descriptor,vector<int,_std::allocator<int>_> *options_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  EnumValueOptions *this_00;
  long *plVar4;
  size_type *psVar5;
  _Alloc_hider _Var6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  OptionsToInterpret local_98;
  
  this_00 = DescriptorPool::Tables::AllocateMessage<google::protobuf::EnumValueOptions>
                      (this->tables_,(EnumValueOptions *)0x0);
  bVar3 = EnumValueOptions::IsInitialized(orig_options);
  if (bVar3) {
    MessageLite::SerializeAsString_abi_cxx11_(&local_98.name_scope,(MessageLite *)orig_options);
    MessageLite::ParseFromString((MessageLite *)this_00,&local_98.name_scope);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name_scope._M_dataplus._M_p != &local_98.name_scope.field_2) {
      operator_delete(local_98.name_scope._M_dataplus._M_p);
    }
    *(EnumValueOptions **)(descriptor + 0x20) = this_00;
    if ((this_00->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      return;
    }
    anon_unknown_1::OptionsToInterpret::OptionsToInterpret
              (&local_98,name_scope,element_name,options_path,&orig_options->super_Message,
               &this_00->super_Message);
    std::
    vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
    ::push_back(&this->options_to_interpret_,&local_98);
    if (local_98.element_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.element_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.element_name._M_dataplus._M_p != &local_98.element_name.field_2) {
      operator_delete(local_98.element_name._M_dataplus._M_p);
    }
    _Var6._M_p = local_98.name_scope._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name_scope._M_dataplus._M_p == &local_98.name_scope.field_2) {
      return;
    }
  }
  else {
    pcVar2 = (name_scope->_M_dataplus)._M_p;
    local_b8[0] = &local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,pcVar2,pcVar2 + name_scope->_M_string_length);
    std::__cxx11::string::append((char *)local_b8);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_b8,(ulong)(element_name->_M_dataplus)._M_p);
    paVar1 = &local_98.name_scope.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_98.name_scope.field_2._M_allocated_capacity = *psVar5;
      local_98.name_scope.field_2._8_8_ = plVar4[3];
      local_98.name_scope._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_98.name_scope.field_2._M_allocated_capacity = *psVar5;
      local_98.name_scope._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_98.name_scope._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    AddError(this,&local_98.name_scope,&orig_options->super_Message,OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98.name_scope._M_dataplus._M_p != paVar1) {
      operator_delete(local_98.name_scope._M_dataplus._M_p);
    }
    _Var6._M_p = (pointer)local_b8[0];
    if (local_b8[0] == &local_a8) {
      return;
    }
  }
  operator_delete(_Var6._M_p);
  return;
}

Assistant:

void DescriptorBuilder::AllocateOptionsImpl(
    const std::string& name_scope, const std::string& element_name,
    const typename DescriptorT::OptionsType& orig_options,
    DescriptorT* descriptor, const std::vector<int>& options_path) {
  // We need to use a dummy pointer to work around a bug in older versions of
  // GCC.  Otherwise, the following two lines could be replaced with:
  //   typename DescriptorT::OptionsType* options =
  //       tables_->AllocateMessage<typename DescriptorT::OptionsType>();
  typename DescriptorT::OptionsType* const dummy = nullptr;
  typename DescriptorT::OptionsType* options = tables_->AllocateMessage(dummy);

  if (!orig_options.IsInitialized()) {
    AddError(name_scope + "." + element_name, orig_options,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "Uninterpreted option is missing name or value.");
    return;
  }

  // Avoid using MergeFrom()/CopyFrom() in this class to make it -fno-rtti
  // friendly. Without RTTI, MergeFrom() and CopyFrom() will fallback to the
  // reflection based method, which requires the Descriptor. However, we are in
  // the middle of building the descriptors, thus the deadlock.
  options->ParseFromString(orig_options.SerializeAsString());
  descriptor->options_ = options;

  // Don't add to options_to_interpret_ unless there were uninterpreted
  // options.  This not only avoids unnecessary work, but prevents a
  // bootstrapping problem when building descriptors for descriptor.proto.
  // descriptor.proto does not contain any uninterpreted options, but
  // attempting to interpret options anyway will cause
  // OptionsType::GetDescriptor() to be called which may then deadlock since
  // we're still trying to build it.
  if (options->uninterpreted_option_size() > 0) {
    options_to_interpret_.push_back(OptionsToInterpret(
        name_scope, element_name, options_path, &orig_options, options));
  }
}